

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall nlohmann::json_schema::root_schema::set_root_schema(root_schema *this,json *sch)

{
  pointer pbVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  invalid_argument *piVar7;
  _Base_ptr p_Var8;
  pointer __k;
  _Base_ptr p_Var9;
  initializer_list<nlohmann::json_uri> __l;
  initializer_list<nlohmann::json_uri> __l_00;
  allocator_type local_1b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  locations;
  string local_198;
  _Rb_tree_node_base *local_178;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
  *__range3;
  json loaded_schema;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_128;
  undefined1 local_110 [16];
  string urefs;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_48;
  
  __range3 = &this->files_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
  ::clear(&__range3->_M_t);
  locations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  locations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  locations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"#",(allocator<char> *)&local_148);
  json_uri::json_uri((json_uri *)&urefs,&local_198);
  __l._M_len = 1;
  __l._M_array = (iterator)&urefs;
  std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
            (&local_128,__l,&local_1b9);
  anon_unknown.dwarf_1d34c::schema::make((schema *)&loaded_schema,sch,this,&locations,&local_128);
  std::shared_ptr<(anonymous_namespace)::schema>::operator=
            (&this->root_,(shared_ptr<(anonymous_namespace)::schema> *)&loaded_schema);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&loaded_schema.m_value);
  std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_128);
  json_uri::~json_uri((json_uri *)&urefs);
  std::__cxx11::string::~string((string *)&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&locations);
  local_178 = &(this->files_)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    p_Var2 = local_178;
    locations.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    locations.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    locations.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var4 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pbVar1 = locations.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, p_Var4 != p_Var2;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&locations,(value_type *)(p_Var4 + 1));
    }
    bVar3 = false;
    for (__k = locations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
               ::operator[](__range3,__k);
      if ((pmVar5->schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        if ((this->loader_).super__Function_base._M_manager == (_Manager_type)0x0) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_198,"external schema reference \'",__k);
          std::operator+(&urefs,&local_198,"\' needs loading, but no loader callback given");
          std::invalid_argument::invalid_argument(piVar7,(string *)&urefs);
          __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&loaded_schema,(nullptr_t)0x0);
        json_uri::json_uri((json_uri *)&urefs,__k);
        std::
        function<void_(const_nlohmann::json_uri_&,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
        ::operator()(&this->loader_,(json_uri *)&urefs,&loaded_schema);
        json_uri::~json_uri((json_uri *)&urefs);
        local_198._M_dataplus._M_p = (pointer)0x0;
        local_198._M_string_length = 0;
        local_198.field_2._M_allocated_capacity = 0;
        json_uri::json_uri((json_uri *)&urefs,__k);
        __l_00._M_len = 1;
        __l_00._M_array = (json_uri *)&urefs;
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_48,__l_00,(allocator_type *)&local_148);
        anon_unknown.dwarf_1d34c::schema::make
                  ((schema *)local_110,&loaded_schema,this,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_198,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_48);
        json_uri::~json_uri((json_uri *)&urefs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_198);
        json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&loaded_schema);
        bVar3 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&locations);
    if (!bVar3) {
      p_Var6 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        if (p_Var6 == local_178) {
          return;
        }
        p_Var9 = p_Var6[4]._M_right;
        if (p_Var9 != (_Base_ptr)0x0) break;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&urefs,"[",(allocator<char> *)&local_198);
      for (p_Var8 = p_Var6[4]._M_parent; p_Var9 = (_Base_ptr)((long)&p_Var9[-1]._M_right + 7),
          p_Var8 != (_Base_ptr)&p_Var6[3]._M_right;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        std::__cxx11::string::append((string *)&urefs);
        if (p_Var9 != (_Base_ptr)0x0) {
          std::__cxx11::string::append((char *)&urefs);
        }
      }
      std::__cxx11::string::append((char *)&urefs);
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var6 + 1),"");
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"<root>",(allocator<char> *)&local_1b9);
      }
      else {
        std::__cxx11::string::string((string *)&local_148,(string *)(p_Var6 + 1));
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &loaded_schema,"after all files have been parsed, \'",&local_148);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locations
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &loaded_schema,"\' has still the following undefined references: ");
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locations
                     ,&urefs);
      std::invalid_argument::invalid_argument(piVar7,(string *)&local_198);
      __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  } while( true );
}

Assistant:

void set_root_schema(json sch)
	{
		files_.clear();
		root_ = schema::make(sch, this, {}, {{"#"}});

		// load all files which have not yet been loaded
		do {
			bool new_schema_loaded = false;

			// files_ is modified during parsing, iterators are invalidated
			std::vector<std::string> locations;
			for (auto &file : files_)
				locations.push_back(file.first);

			for (auto &loc : locations) {
				if (files_[loc].schemas.size() == 0) { // nothing has been loaded for this file
					if (loader_) {
						json loaded_schema;

						loader_(loc, loaded_schema);

						schema::make(loaded_schema, this, {}, {{loc}});
						new_schema_loaded = true;
					} else {
						throw std::invalid_argument("external schema reference '" + loc + "' needs loading, but no loader callback given");
					}
				}
			}

			if (!new_schema_loaded) // if no new schema loaded, no need to try again
				break;
		} while (1);

		for (const auto &file : files_) {
			if (file.second.unresolved.size() != 0) {
				// Build a representation of the undefined
				// references as a list of comma-separated strings.
				auto n_urefs = file.second.unresolved.size();
				std::string urefs = "[";

				decltype(n_urefs) counter = 0;
				for (const auto &p : file.second.unresolved) {
					urefs += p.first;

					if (counter != n_urefs - 1u) {
						urefs += ", ";
					}

					++counter;
				}

				urefs += "]";

				throw std::invalid_argument("after all files have been parsed, '" +
				                            (file.first == "" ? "<root>" : file.first) +
				                            "' has still the following undefined references: " + urefs);
			}
		}
	}